

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O0

shared_ptr<IC> __thiscall Infector::Container::buildSingle_delegate<IC>(Container *this)

{
  IAnyShared *pIVar1;
  IC *pIVar2;
  bool bVar3;
  int iVar4;
  pointer ppVar5;
  pointer ppVar6;
  undefined4 extraout_var;
  pointer ppVar7;
  void *pvVar8;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Container *in_RSI;
  shared_ptr<IC> sVar9;
  shared_ptr<int> local_a0;
  shared_ptr<IC> local_90;
  exception *ex;
  type_index local_60;
  element_type *local_58;
  IC *myPointer;
  IAnyShared *any;
  iterator it3;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  local_38;
  iterator it2;
  type_index local_28;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
  local_20;
  iterator it;
  Container *this_local;
  
  std::type_index::type_index(&local_28,(type_info *)&IC::typeinfo);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
       ::find(&in_RSI->typeMap,&local_28);
  it2.
  super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
             )std::
              unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
              ::end(&in_RSI->typeMap);
  bVar3 = std::__detail::operator==
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                      *)&it2);
  if (bVar3) {
    launch_exception<Infector::ExBuildWhat>(in_RSI);
  }
  ppVar5 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  if (((ppVar5->second).single & 1U) == 0) {
    launch_exception<Infector::ExSingleMulti>(in_RSI);
  }
  ppVar5 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
       ::find(&in_RSI->callbacks,&(ppVar5->second).type);
  it3.super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>)
           std::
           unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
           ::end(&in_RSI->callbacks);
  bVar3 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                      *)&it3);
  if (bVar3) {
    launch_exception<Infector::ExNotWired>(in_RSI);
  }
  ppVar5 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  any = (IAnyShared *)
        std::
        unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
        ::find(&in_RSI->singleIstances,&(ppVar5->second).type);
  ppVar6 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>
                       *)&any);
  pIVar1 = ppVar6->second;
  myPointer = (IC *)pIVar1;
  std::type_index::type_index(&local_60,(type_info *)&IC::typeinfo);
  iVar4 = (**pIVar1->_vptr_IAnyShared)(pIVar1,local_60._M_target);
  pIVar2 = myPointer;
  local_58 = (element_type *)CONCAT44(extraout_var,iVar4);
  if (local_58 == (element_type *)0x0) {
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false,_false>
                           *)&local_38);
    pvVar8 = std::function<void_*(Infector::Container::EmplaceContext_*)>::operator()
                       (&ppVar7->second,(EmplaceContext *)0x0);
    (*pIVar2->_vptr_IC[1])(pIVar2,pvVar8);
    pIVar2 = myPointer;
    std::type_index::type_index((type_index *)&ex,(type_info *)&IC::typeinfo);
    iVar4 = (**pIVar2->_vptr_IC)(pIVar2,ex);
    local_58 = (element_type *)CONCAT44(extraout_var_00,iVar4);
  }
  if (local_58 == (element_type *)0x0) {
    launch_exception<Infector::ExAnySharedNullPtr>(in_RSI);
  }
  (*myPointer->_vptr_IC[2])(&local_a0);
  std::shared_ptr<IC>::shared_ptr<int>(&local_90,&local_a0,local_58);
  std::shared_ptr<IC>::shared_ptr((shared_ptr<IC> *)this,&local_90);
  std::shared_ptr<IC>::~shared_ptr(&local_90);
  std::shared_ptr<int>::~shared_ptr(&local_a0);
  sVar9.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar9.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<IC>)sVar9.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> Container::buildSingle_delegate(){
        auto it = typeMap.find( std::type_index(typeid(T)) );
        if( it==typeMap.end()) //"it" is concrete type, T abstract one
            launch_exception<ExBuildWhat>(); // TYPE NOT REGISTERED

        if( it->second.single == false)
            launch_exception<ExSingleMulti>(); // T must be single

        //at this point may happen that concrete type and abstract ones are the
        //same.that's ok. (bindSingleAsNothing)
        auto it2 = callbacks.find(  it->second.type ); //find constructor

        if( it2==callbacks.end())
            launch_exception<ExNotWired>(); // CONSTRUCTOR NOT WIRED

        auto it3 = singleIstances.find( it->second.type );

        IAnyShared * any = it3->second;
        T* myPointer = reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );
        if(myPointer==nullptr){
            try{
                any->setPtr( (it2->second)(nullptr) );
                myPointer =  reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );

            }catch(std::exception & ex){
                throw ex;
            }catch(...){
                launch_exception<ExUnkownException>();
            }
        }

        if(myPointer == nullptr)
                launch_exception<ExAnySharedNullPtr>();

        return std::move(std::shared_ptr<T> (
                                any->getReferenceCounter(),
                                myPointer ));
    }